

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_load(CompilerHLSL *this,Instruction *instruction)

{
  uint result_id;
  ID id;
  Variant *pVVar1;
  _Hash_node_base *p_Var2;
  SPIRAccessChain *pSVar3;
  bool bVar4;
  ExecutionModel EVar5;
  uint32_t uVar6;
  uint32_t *puVar7;
  SPIRType *type;
  SPIRType *type_00;
  SPIRExpression *e;
  ulong uVar8;
  char **in_R8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  uint32_t index;
  ulong uVar11;
  string load_expr;
  string local_b0;
  ulong local_90;
  SPIRAccessChain *local_88;
  ulong local_80;
  string local_78;
  char *local_58;
  string local_50;
  
  puVar7 = Compiler::stream((Compiler *)this,instruction);
  local_90 = (ulong)*puVar7;
  result_id = puVar7[1];
  id.id = puVar7[2];
  uVar11 = (ulong)id.id;
  if ((uVar11 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar11].type == TypeAccessChain))
  {
    local_88 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar1 + uVar11);
  }
  else {
    local_88 = (SPIRAccessChain *)0x0;
  }
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr + local_90);
  if (local_88 != (SPIRAccessChain *)0x0) {
    if (((type->array).super_VectorView<unsigned_int>.buffer_size != 0) ||
       (type->basetype == Struct)) {
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,(uint32_t)local_90,result_id);
      CompilerGLSL::to_expression_abi_cxx11_(&local_b0,&this->super_CompilerGLSL,result_id,true);
      pSVar3 = local_88;
      read_access_chain(this,(string *)0x0,&local_b0,local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      CompilerGLSL::track_expression_read
                (&this->super_CompilerGLSL,(pSVar3->super_IVariant).self.id);
      return;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_80 = uVar11;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    pSVar3 = local_88;
    read_access_chain(this,&local_b0,&local_78,local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    bVar4 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,(uint32_t)local_80);
    if (bVar4) {
      uVar11 = (this->super_CompilerGLSL).super_Compiler.forced_temporaries._M_h._M_bucket_count;
      uVar8 = (ulong)result_id % uVar11;
      p_Var9 = (this->super_CompilerGLSL).super_Compiler.forced_temporaries._M_h._M_buckets[uVar8];
      p_Var10 = (__node_base_ptr)0x0;
      if ((p_Var9 != (__node_base_ptr)0x0) &&
         (p_Var2 = p_Var9->_M_nxt, p_Var10 = p_Var9, result_id != *(uint *)&p_Var9->_M_nxt[1]._M_nxt
         )) {
        while (p_Var9 = p_Var2, p_Var2 = p_Var9->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
          p_Var10 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar11 != uVar8) ||
             (p_Var10 = p_Var9, result_id == *(uint *)&p_Var2[1]._M_nxt)) goto LAB_001e26fe;
        }
        p_Var10 = (__node_base_ptr)0x0;
      }
LAB_001e26fe:
      if (p_Var10 == (__node_base_ptr)0x0) {
        bVar4 = true;
      }
      else {
        bVar4 = p_Var10->_M_nxt == (_Hash_node_base *)0x0;
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4 == false) {
      CompilerGLSL::track_expression_read
                (&this->super_CompilerGLSL,(pSVar3->super_IVariant).self.id);
    }
    bVar4 = (bool)(bVar4 & type->columns < 2);
    e = CompilerGLSL::emit_op
                  (&this->super_CompilerGLSL,(uint32_t)local_90,result_id,&local_b0,bVar4,true);
    e->need_transpose = false;
    uVar6 = (uint32_t)local_80;
    Compiler::register_read((Compiler *)this,result_id,uVar6,bVar4);
    Compiler::inherit_expression_dependencies((Compiler *)this,result_id,uVar6);
    if (bVar4 != false) {
      Compiler::add_implied_read_expression((Compiler *)this,e,(local_88->super_IVariant).self.id);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
LAB_001e279f:
    operator_delete(local_b0._M_dataplus._M_p);
    return;
  }
  EVar5 = Compiler::get_execution_model((Compiler *)this);
  if ((((EVar5 == ExecutionModelMeshEXT) &&
       (bVar4 = Compiler::has_decoration((Compiler *)this,id,BuiltIn), bVar4)) &&
      ((uVar6 = Compiler::get_decoration((Compiler *)this,id,BuiltIn), uVar6 == 3 ||
       (uVar6 = Compiler::get_decoration((Compiler *)this,id,BuiltIn), uVar6 == 4)))) &&
     (bVar4 = Compiler::is_array((Compiler *)this,type), bVar4)) {
    type_00 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (type->parent_type).id);
    bVar4 = Compiler::is_array((Compiler *)this,type_00);
    if ((!bVar4) &&
       (uVar6 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type), 1 < uVar6)) {
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,id.id);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"{ ","");
      uVar6 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
      if (uVar6 != 0) {
        index = 0;
        do {
          CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id.id,true);
          local_58 = CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,index);
          join<std::__cxx11::string,char_const(&)[2],char_const*>
                    (&local_78,(spirv_cross *)&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35dc3b,
                     (char (*) [2])&local_58,in_R8);
          ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_78._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          index = index + 1;
          if (index < uVar6) {
            ::std::__cxx11::string::append((char *)&local_b0);
          }
        } while (uVar6 != index);
      }
      ::std::__cxx11::string::append((char *)&local_b0);
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,(uint32_t)local_90,result_id,&local_b0,false,false);
      Compiler::register_read((Compiler *)this,result_id,id.id,false);
      Compiler::inherit_expression_dependencies((Compiler *)this,result_id,id.id);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
        return;
      }
      goto LAB_001e279f;
    }
  }
  CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
  return;
}

Assistant:

void CompilerHLSL::emit_load(const Instruction &instruction)
{
	auto ops = stream(instruction);

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];
	uint32_t ptr = ops[2];

	auto *chain = maybe_get<SPIRAccessChain>(ptr);
	if (chain)
	{
		auto &type = get<SPIRType>(result_type);
		bool composite_load = !type.array.empty() || type.basetype == SPIRType::Struct;

		if (composite_load)
		{
			// We cannot make this work in one single expression as we might have nested structures and arrays,
			// so unroll the load to an uninitialized temporary.
			emit_uninitialized_temporary_expression(result_type, id);
			read_access_chain(nullptr, to_expression(id), *chain);
			track_expression_read(chain->self);
		}
		else
		{
			string load_expr;
			read_access_chain(&load_expr, "", *chain);

			bool forward = should_forward(ptr) && forced_temporaries.find(id) == end(forced_temporaries);

			// If we are forwarding this load,
			// don't register the read to access chain here, defer that to when we actually use the expression,
			// using the add_implied_read_expression mechanism.
			if (!forward)
				track_expression_read(chain->self);

			// Do not forward complex load sequences like matrices, structs and arrays.
			if (type.columns > 1)
				forward = false;

			auto &e = emit_op(result_type, id, load_expr, forward, true);
			e.need_transpose = false;
			register_read(id, ptr, forward);
			inherit_expression_dependencies(id, ptr);
			if (forward)
				add_implied_read_expression(e, chain->self);
		}
	}
	else
	{
		// Very special case where we cannot rely on IO lowering.
		// Mesh shader clip/cull arrays ... Cursed.
		auto &res_type = get<SPIRType>(result_type);
		if (get_execution_model() == ExecutionModelMeshEXT &&
		    has_decoration(ptr, DecorationBuiltIn) &&
		    (get_decoration(ptr, DecorationBuiltIn) == BuiltInClipDistance ||
		     get_decoration(ptr, DecorationBuiltIn) == BuiltInCullDistance) &&
		    is_array(res_type) && !is_array(get<SPIRType>(res_type.parent_type)) &&
		    to_array_size_literal(res_type) > 1)
		{
			track_expression_read(ptr);
			string load_expr = "{ ";
			uint32_t num_elements = to_array_size_literal(res_type);
			for (uint32_t i = 0; i < num_elements; i++)
			{
				load_expr += join(to_expression(ptr), ".", index_to_swizzle(i));
				if (i + 1 < num_elements)
					load_expr += ", ";
			}
			load_expr += " }";
			emit_op(result_type, id, load_expr, false);
			register_read(id, ptr, false);
			inherit_expression_dependencies(id, ptr);
		}
		else
		{
			CompilerGLSL::emit_instruction(instruction);
		}
	}
}